

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

bool bssl::anon_unknown_0::ConnectClientAndServer
               (UniquePtr<SSL> *out_client,UniquePtr<SSL> *out_server,SSL_CTX *client_ctx,
               SSL_CTX *server_ctx,ClientConfig *config,bool shed_handshake_config)

{
  bool bVar1;
  int iVar2;
  pointer psVar3;
  SSL *to;
  ulong uVar4;
  char *pcVar5;
  pointer server_00;
  unique_ptr<ssl_st,_bssl::internal::Deleter> local_50;
  UniquePtr<SSL> server;
  UniquePtr<SSL> client;
  bool shed_handshake_config_local;
  ClientConfig *config_local;
  SSL_CTX *server_ctx_local;
  SSL_CTX *client_ctx_local;
  UniquePtr<SSL> *out_server_local;
  UniquePtr<SSL> *out_client_local;
  
  std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&server);
  std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&local_50);
  bVar1 = CreateClientAndServer(&server,(UniquePtr<SSL> *)&local_50,client_ctx,server_ctx);
  if (bVar1) {
    if ((config->early_data & 1U) != 0) {
      psVar3 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
      SSL_set_early_data_enabled(psVar3,1);
    }
    if (config->session != (SSL_SESSION *)0x0) {
      to = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
      SSL_set_session(to,(SSL_SESSION *)config->session);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      psVar3 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      iVar2 = SSL_set_tlsext_host_name(psVar3,pcVar5);
      if (iVar2 == 0) {
        out_client_local._7_1_ = false;
        goto LAB_0019c8eb;
      }
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      psVar3 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      iVar2 = SSL_set1_host(psVar3,pcVar5);
      if (iVar2 == 0) {
        out_client_local._7_1_ = false;
        goto LAB_0019c8eb;
      }
      psVar3 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
      SSL_set_hostflags(psVar3,config->hostflags);
    }
    if (config->ca_names != (stack_st_CRYPTO_BUFFER *)0x0) {
      psVar3 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
      SSL_set0_CA_names(psVar3,config->ca_names);
    }
    psVar3 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
    SSL_set_shed_handshake_config(psVar3,shed_handshake_config & 1);
    psVar3 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&local_50);
    SSL_set_shed_handshake_config(psVar3,shed_handshake_config & 1);
    psVar3 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
    server_00 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&local_50);
    bVar1 = CompleteHandshakes(psVar3,server_00);
    if (bVar1) {
      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::operator=(out_client,&server);
      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::operator=(out_server,&local_50);
      out_client_local._7_1_ = true;
    }
    else {
      out_client_local._7_1_ = false;
    }
  }
  else {
    out_client_local._7_1_ = false;
  }
LAB_0019c8eb:
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&local_50);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
  return out_client_local._7_1_;
}

Assistant:

static bool ConnectClientAndServer(bssl::UniquePtr<SSL> *out_client,
                                   bssl::UniquePtr<SSL> *out_server,
                                   SSL_CTX *client_ctx, SSL_CTX *server_ctx,
                                   const ClientConfig &config = ClientConfig(),
                                   bool shed_handshake_config = true) {
  bssl::UniquePtr<SSL> client, server;
  if (!CreateClientAndServer(&client, &server, client_ctx, server_ctx)) {
    return false;
  }
  if (config.early_data) {
    SSL_set_early_data_enabled(client.get(), 1);
  }
  if (config.session) {
    SSL_set_session(client.get(), config.session);
  }
  if (!config.servername.empty() &&
      !SSL_set_tlsext_host_name(client.get(), config.servername.c_str())) {
    return false;
  }
  if (!config.verify_hostname.empty()) {
    if (!SSL_set1_host(client.get(), config.verify_hostname.c_str())) {
      return false;
    }
    SSL_set_hostflags(client.get(), config.hostflags);
  }

  if (config.ca_names) {
    SSL_set0_CA_names(client.get(), config.ca_names);
  }

  SSL_set_shed_handshake_config(client.get(), shed_handshake_config);
  SSL_set_shed_handshake_config(server.get(), shed_handshake_config);

  if (!CompleteHandshakes(client.get(), server.get())) {
    return false;
  }

  *out_client = std::move(client);
  *out_server = std::move(server);
  return true;
}